

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imath.hpp
# Opt level: O0

long primesum::iroot<3,long>(long x)

{
  long lVar1;
  long in_RDI;
  double dVar2;
  long r;
  long local_10;
  
  dVar2 = pow((double)in_RDI,0.3333333333333333);
  for (local_10 = (long)dVar2;
      (0 < local_10 && (lVar1 = ipow<long>(local_10,2), in_RDI / local_10 < lVar1));
      local_10 = local_10 + -1) {
  }
  for (; lVar1 = ipow<long>(local_10 + 1,2), lVar1 <= in_RDI / (local_10 + 1);
      local_10 = local_10 + 1) {
  }
  return local_10;
}

Assistant:

inline T iroot(T x)
{
  if (N == 0)
    return 0;

  T r = (T) std::pow((double) x, 1.0 / N);

  // fix root too large
  for (; r > 0; r--)
  {
    if (ipow(r, N - 1) <= x / r)
      break;
  }

  // fix root too small
  while (ipow(r + 1, N - 1) <= x / (r + 1))
    r += 1;

  return r;
}